

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::update_target_priority(raft_server *this)

{
  _Hash_node_base *p_Var1;
  element_type *peVar2;
  int iVar3;
  int iVar4;
  string local_30;
  
  iVar4 = this->my_priority_;
  for (p_Var1 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    iVar3 = *(int *)((long)&(p_Var1[2]._M_nxt)->_M_nxt[9]._M_nxt + 4);
    if (iVar3 < iVar4) {
      iVar3 = iVar4;
    }
    iVar4 = iVar3;
  }
  iVar3 = 1;
  if (1 < iVar4) {
    iVar3 = iVar4;
  }
  this->target_priority_ = iVar3;
  timer_helper::reset(&this->priority_change_timer_);
  LOCK();
  (this->hb_alive_)._M_base._M_i = true;
  UNLOCK();
  (this->pre_vote_).term_ =
       (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       term_).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  (this->pre_vote_).done_._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).dead_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).live_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2 != (element_type *)0x0) &&
     (iVar4 = (**(code **)(*(long *)peVar2 + 0x38))(), 5 < iVar4)) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_30,"(update) new target priority: %d",(ulong)(uint)this->target_priority_);
    (**(code **)(*(long *)peVar2 + 0x40))
              (peVar2,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
               ,"update_target_priority",0xef,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void raft_server::update_target_priority() {
    // Get max priority among all peers, including myself.
    int32 max_priority = my_priority_;
    for (auto& entry: peers_) {
        peer* peer_elem = entry.second.get();
        const srv_config& s_conf = peer_elem->get_config();
        int32 cur_priority = s_conf.get_priority();
        max_priority = std::max(max_priority, cur_priority);
    }
    if (max_priority > 0) {
        target_priority_ = max_priority;
    } else {
        target_priority_ = srv_config::INIT_PRIORITY;
    }
    priority_change_timer_.reset();

    hb_alive_ = true;
    pre_vote_.reset(state_->get_term());
    p_tr("(update) new target priority: %d", target_priority_);
}